

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

void __thiscall Kss_Emu::cpu_write(Kss_Emu *this,uint addr,int data)

{
  uint uVar1;
  time_t tVar2;
  byte in_DL;
  time_t *in_RSI;
  long in_RDI;
  int scc_addr;
  
  uVar1 = (uint)in_RSI;
  if (uVar1 == 0x9000) {
    set_bank(this,addr,data);
  }
  else if (uVar1 == 0xb000) {
    set_bank(this,addr,data);
  }
  else {
    uVar1 = uVar1 & 0xdfff ^ 0x9800;
    if (uVar1 < 0x90) {
      *(undefined1 *)(in_RDI + 0x4d8) = 1;
      tVar2 = Kss_Cpu::time((Kss_Cpu *)(in_RDI + 0x1c8),in_RSI);
      Scc_Apu::write((Scc_Apu *)(in_RDI + 0x10b20),(int)tVar2,(void *)(ulong)uVar1,(ulong)in_DL);
    }
  }
  return;
}

Assistant:

void Kss_Emu::cpu_write( unsigned addr, int data )
{
	data &= 0xFF;
	switch ( addr )
	{
	case 0x9000:
		set_bank( 0, data );
		return;
	
	case 0xB000:
		set_bank( 1, data );
		return;
	}
	
	int scc_addr = (addr & 0xDFFF) ^ 0x9800;
	if ( scc_addr < scc.reg_count )
	{
		scc_accessed = true;
		scc.write( time(), scc_addr, data );
		return;
	}
	
	debug_printf( "LD ($%04X),$%02X\n", addr, data );
}